

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  TestPartResultArray *this;
  char *__dest;
  TestPartResult *pTVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  long lVar4;
  size_t sVar5;
  AssertionResult *this_00;
  int index;
  ostream *this_01;
  ostream *poVar6;
  undefined4 in_register_00000084;
  Type TVar7;
  char *pcVar8;
  AssertionResult AVar9;
  Message msg;
  String expected;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  String local_58;
  AssertionResult *local_48;
  AssertionResult local_40;
  
  TVar7 = (Type)substr;
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar8 = "1 non-fatal failure";
  if (TVar7 == kFatalFailure) {
    pcVar8 = "1 fatal failure";
  }
  lVar4 = (ulong)(TVar7 != kFatalFailure) * 4;
  local_48 = (AssertionResult *)param_1;
  __dest = (char *)operator_new__(lVar4 + 0x10);
  memcpy(__dest,pcVar8,lVar4 + 0xfU);
  __dest[lVar4 + 0xf] = '\0';
  local_58.c_str_ = __dest;
  local_58.length_ = lVar4 + 0xfU;
  Message::Message((Message *)&local_60);
  if ((*(long *)(this + 8) - *(long *)this & 0x3fffffffc0U) == 0x40) {
    pTVar1 = TestPartResultArray::GetTestPartResult(this,0);
    if (pTVar1->type_ == TVar7) {
      pcVar8 = strstr((pTVar1->message_).c_str_,*(char **)msg.ss_.ptr_);
      this_00 = local_48;
      if (pcVar8 != (char *)0x0) {
        local_48->success_ = true;
        (local_48->message_).ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        sVar3.ptr_ = extraout_RDX;
        goto LAB_0015d666;
      }
      local_40.success_ = false;
      local_40.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_40,(char (*) [11])0x178f33);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_58);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [14])" containing \"");
      pAVar2 = AssertionResult::operator<<
                         (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)msg.ss_.ptr_);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x179729);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])"  Actual:\n");
      pAVar2 = AssertionResult::operator<<(pAVar2,pTVar1);
      AssertionResult::AssertionResult(this_00,pAVar2);
    }
    else {
      local_40.success_ = false;
      local_40.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_40,(char (*) [11])0x178f33);
      this_00 = local_48;
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_58);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x179676);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])"  Actual:\n");
      pAVar2 = AssertionResult::operator<<(pAVar2,pTVar1);
      AssertionResult::AssertionResult(this_00,pAVar2);
    }
  }
  else {
    poVar6 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Expected: ",10);
    pcVar8 = local_58.c_str_;
    poVar6 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    if (local_58.c_str_ == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(null)",6);
    }
    else if (local_58.length_ != 0) {
      sVar5 = 0;
      do {
        if (pcVar8[sVar5] == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\0",2);
        }
        else {
          local_40.success_ = (bool)pcVar8[sVar5];
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_40.success_,1);
        }
        sVar5 = sVar5 + 1;
      } while (sVar5 != local_58.length_);
    }
    poVar6 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    poVar6 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  Actual: ",10);
    this_01 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_01 = (ostream *)0x0;
    }
    std::ostream::operator<<(this_01,(int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6));
    poVar6 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," failures",9);
    if (0 < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6)) {
      index = 0;
      do {
        poVar6 = (ostream *)(local_60.ptr_ + 0x10);
        if (local_60.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          poVar6 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        pTVar1 = TestPartResultArray::GetTestPartResult(this,index);
        poVar6 = (ostream *)(local_60.ptr_ + 0x10);
        if (local_60.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          poVar6 = (ostream *)0x0;
        }
        testing::operator<<(poVar6,pTVar1);
        index = index + 1;
      } while (index < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6));
    }
    local_40.success_ = false;
    local_40.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar2 = AssertionResult::operator<<(&local_40,(Message *)&local_60);
    this_00 = local_48;
    AssertionResult::AssertionResult(local_48,pAVar2);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar3.ptr_ = extraout_RDX_00;
LAB_0015d666:
  if (local_60.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_60.ptr_ + 8))();
    local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar3.ptr_ = extraout_RDX_01;
  }
  if (local_58.c_str_ != (char *)0x0) {
    operator_delete__(local_58.c_str_);
    sVar3.ptr_ = extraout_RDX_02;
  }
  AVar9.message_.ptr_ = sVar3.ptr_;
  AVar9._0_8_ = this_00;
  return AVar9;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const string& substr) {
  const String expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == NULL) {
    return AssertionFailure() << "Expected: " << expected << " containing \""
                              << substr << "\"\n"
                              << "  Actual:\n"
                              << r;
  }

  return AssertionSuccess();
}